

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfcn.c
# Opt level: O0

ssize_t mpt_memrfcn(iovec *data,size_t ndat,_func_int_int_void_ptr *fcn,void *par)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  _func_int_int_void_ptr *p_Var5;
  size_t local_48;
  size_t pos;
  uchar *tmp;
  size_t i;
  void *par_local;
  _func_int_int_void_ptr *fcn_local;
  size_t ndat_local;
  iovec *data_local;
  
  if ((data == (iovec *)0x0) || (tmp = (uchar *)ndat, fcn == (_func_int_int_void_ptr *)0x0)) {
    piVar4 = __errno_location();
    *piVar4 = 0xe;
    data_local = (iovec *)0xffffffffffffffff;
  }
  else {
    while (p_Var5 = (_func_int_int_void_ptr *)(tmp + -1), tmp != (uchar *)0x0) {
      pvVar1 = data[(long)p_Var5].iov_base;
      local_48 = data[(long)p_Var5].iov_len;
      while (lVar2 = local_48 - 1, tmp = (uchar *)p_Var5, local_48 != 0) {
        iVar3 = (*fcn)((int)*(undefined1 *)(lVar2 + (long)pvVar1),par);
        local_48 = lVar2;
        if (iVar3 != 0) {
          fcn_local = (_func_int_int_void_ptr *)0x0;
          while( true ) {
            if (p_Var5 <= fcn_local) {
              return local_48;
            }
            local_48 = local_48 + data[(long)fcn_local].iov_len;
            if (0x7fffffffffffffff < local_48) break;
            fcn_local = fcn_local + 1;
          }
          piVar4 = __errno_location();
          *piVar4 = 0x4b;
          return -1;
        }
      }
    }
    piVar4 = __errno_location();
    *piVar4 = 0xb;
    data_local = (iovec *)0xfffffffffffffffe;
  }
  return (ssize_t)data_local;
}

Assistant:

extern ssize_t mpt_memrfcn(const struct iovec *data, size_t ndat, int (*fcn)(int , void *), void *par)
{
	size_t i = ndat;
	
	if (!data || !fcn) {
		errno = EFAULT; return -1;
	}
	
	while (i--) {
		unsigned char *tmp = data[i].iov_base;
		size_t pos = data[i].iov_len;
		
		while (pos--) {
			if (fcn(tmp[pos], par)) {
				for (ndat = 0; ndat < i; ++ndat) {
					if ((pos += data[ndat].iov_len) > SSIZE_MAX) {
						errno = EOVERFLOW;
						return -1;
					}
				}
				return pos;
			}
		}
	}
	
	errno = EAGAIN;
	
	return -2;
}